

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

int double_conversion::Bignum::PlusCompare(Bignum *a,Bignum *b,Bignum *c)

{
  long lVar1;
  short sVar2;
  Bignum *pBVar3;
  int iVar4;
  int iVar5;
  Bignum *pBVar6;
  uint uVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  short sVar15;
  Chunk CVar16;
  uint uVar17;
  
  uVar7 = (uint)(ushort)a->used_bigits_;
  uVar9 = (uint)(ushort)a->exponent_;
  do {
    pBVar6 = a;
    a = b;
    sVar8 = (short)uVar9;
    iVar10 = (int)sVar8;
    iVar11 = (short)uVar7 + iVar10;
    uVar7 = (uint)a->used_bigits_;
    sVar15 = a->exponent_;
    uVar9 = (uint)sVar15;
    iVar4 = uVar7 + uVar9;
    b = pBVar6;
  } while (iVar11 < iVar4);
  sVar2 = c->exponent_;
  lVar1 = (long)sVar2 + (long)c->used_bigits_;
  iVar5 = (int)lVar1;
  if (iVar11 + 1 < iVar5) {
    return -1;
  }
  if (iVar11 <= iVar5) {
    if ((iVar4 <= iVar10) && (iVar11 < iVar5)) {
      return -1;
    }
    if (sVar8 <= sVar15) {
      sVar15 = pBVar6->exponent_;
    }
    sVar8 = sVar2;
    if (sVar15 <= sVar2) {
      sVar8 = sVar15;
    }
    if (iVar5 <= sVar8) {
      return 0;
    }
    pBVar3 = (Bignum *)(c->bigits_buffer_ + (long)c->used_bigits_ + -1);
    iVar5 = 0;
    lVar14 = lVar1;
    while( true ) {
      iVar13 = 0;
      if ((iVar10 < lVar14) && (lVar14 <= iVar11)) {
        iVar13 = *(int *)((long)pBVar6 + lVar14 * 4 + (long)iVar10 * -4);
      }
      CVar16 = 0;
      iVar12 = 0;
      if (((int)uVar9 < lVar14) && (lVar14 <= iVar4)) {
        iVar12 = *(int *)((long)a + lVar14 * 4 + (long)(int)uVar9 * -4);
      }
      if (sVar2 < lVar14 && lVar14 <= lVar1) {
        CVar16._0_2_ = pBVar3->used_bigits_;
        CVar16._2_2_ = pBVar3->exponent_;
      }
      uVar17 = CVar16 + iVar5;
      uVar7 = iVar12 + iVar13;
      if (uVar17 < uVar7) break;
      if (1 < uVar17 - uVar7) {
        return -1;
      }
      lVar14 = lVar14 + -1;
      iVar5 = (uVar17 - uVar7) * 0x10000000;
      pBVar3 = (Bignum *)((long)(pBVar3 + 0xffffffffffffffff) + 0x200);
      if (lVar14 <= sVar8) {
        return -(uint)(uVar17 != uVar7);
      }
    }
  }
  return 1;
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  // Required capacity could be reduced by ignoring leading zeros.
  EnsureCapacity(((value.length() * 4) + kBigitSize - 1) / kBigitSize);
  DOUBLE_CONVERSION_ASSERT(sizeof(uint64_t) * 8 >= kBigitSize + 4);  // TODO: static_assert
  // Accumulates converted hex digits until at least kBigitSize bits.
  // Works with non-factor-of-four kBigitSizes.
  uint64_t tmp = 0;  // Accumulates converted hex digits until at least
  for (int cnt = 0; !value.is_empty(); value.pop_back()) {
    tmp |= (HexCharValue(value.last()) << cnt);
    if ((cnt += 4) >= kBigitSize) {
      RawBigit(used_bigits_++) = (tmp & kBigitMask);
      cnt -= kBigitSize;
      tmp >>= kBigitSize;
    }
  }
  if (tmp > 0) {
    RawBigit(used_bigits_++) = tmp;
  }
  Clamp();
}